

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O3

void __thiscall Executor::runThread(Executor *this)

{
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *this_00;
  _List_node_base *p_Var1;
  undefined8 uVar2;
  unique_lock<std::mutex> lock;
  Task task;
  unique_lock<std::mutex> local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  if (this->closed == false) {
    this_00 = &this->pendingTasks;
    do {
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_68._M_owns = false;
      local_68._M_device = &this->mutex;
      std::unique_lock<std::mutex>::lock(&local_68);
      local_68._M_owns = true;
      p_Var1 = (this_00->
               super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
               _M_impl._M_node.super__List_node_base._M_next;
      if (p_Var1 == (_List_node_base *)this_00) {
        std::condition_variable::wait((unique_lock *)&this->notification);
        std::unique_lock<std::mutex>::~unique_lock(&local_68);
      }
      else {
        std::function<void_()>::operator=
                  ((function<void_()> *)&local_58,(function<void_()> *)(p_Var1 + 1));
        std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
        _M_erase(this_00,(this_00->
                         super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                         )._M_impl._M_node.super__List_node_base._M_next);
        std::unique_lock<std::mutex>::~unique_lock(&local_68);
        if (local_48 == (code *)0x0) {
          uVar2 = std::__throw_bad_function_call();
          __clang_call_terminate(uVar2);
        }
        (*pcStack_40)(&local_58);
      }
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
    } while (this->closed == false);
  }
  return;
}

Assistant:

void Executor::runThread() {
    while (!closed) {
        Task task;

        {
            std::unique_lock<std::mutex> lock(mutex);

            if (pendingTasks.empty()) {
                notification.wait(lock);
                continue;
            } else {
                task = pendingTasks.front();
                pendingTasks.pop_front();
            }
        }

        task();
    }
}